

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElement.h
# Opt level: O0

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall
ninx::parser::element::ASTElement::clone<ninx::parser::element::Expression>(ASTElement *this)

{
  int iVar1;
  undefined4 extraout_var;
  pointer pEVar2;
  Block *pBVar3;
  ASTElement *in_RSI;
  pointer local_58;
  ASTElement *this_local;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *new_obj;
  
  iVar1 = (*in_RSI->_vptr_ASTElement[6])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_58 = (pointer)0x0;
  }
  else {
    local_58 = (pointer)__dynamic_cast(CONCAT44(extraout_var,iVar1),&typeinfo,&Expression::typeinfo,
                                       0);
  }
  std::
  unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
  ::unique_ptr<std::default_delete<ninx::parser::element::Expression>,void>
            ((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
              *)this,local_58);
  pEVar2 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                         *)this);
  pBVar3 = get_parent(in_RSI);
  (*(pEVar2->super_Statement).super_ASTElement._vptr_ASTElement[4])(pEVar2,pBVar3);
  pEVar2 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                         *)this);
  pBVar3 = __get_output_block(in_RSI);
  (*(pEVar2->super_Statement).super_ASTElement._vptr_ASTElement[5])(pEVar2,pBVar3);
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> clone() {
                    std::unique_ptr<T> new_obj(dynamic_cast<T*>(clone_impl()));
                    new_obj->set_parent(this->get_parent());
                    new_obj->__set_output_block(this->__get_output_block());
                    return new_obj;
                }